

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

ProfileData *
anon_unknown.dwarf_39c7d::readProfile(ProfileData *__return_storage_ptr__,string *file)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  ProfileData *extraout_RAX;
  ProfileData *extraout_RAX_00;
  ProfileData *extraout_RAX_01;
  ProfileData *pPVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_200 [392];
  ulong local_78;
  uint64_t *local_70;
  vector<char,_std::allocator<char>_> profileData;
  long local_60;
  undefined1 auStack_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> timestamps;
  
  wasm::read_file<std::vector<char,std::allocator<char>>>((string *)&local_70,(BinaryOption)file);
  uVar6 = _profileData - (long)local_70;
  if (uVar6 < 4) {
    wasm::Fatal::Fatal((Fatal *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200 + 0x10),"Unexpected end of profile data in ",0x22);
    wasm::Fatal::operator<<((Fatal *)local_200,file);
  }
  else {
    if (7 < uVar6) {
      uVar2 = *local_70;
      auStack_58 = (undefined1  [8])0x0;
      timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (uVar6 != 8) {
        puVar3 = local_70;
        lVar5 = _profileData;
        uVar7 = 8;
        do {
          uVar1 = uVar7 + 4;
          if (uVar6 < uVar1) {
            wasm::Fatal::Fatal((Fatal *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_200 + 0x10),"Unexpected end of profile data in ",0x22);
            wasm::Fatal::operator<<((Fatal *)local_200,file);
            goto LAB_0010f008;
          }
          local_78 = (ulong)*(uint *)((long)puVar3 + uVar7);
          if (timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_58,
                       (iterator)
                       timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_78);
            puVar3 = local_70;
            lVar5 = _profileData;
          }
          else {
            *timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start = local_78;
            timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          uVar6 = lVar5 - (long)puVar3;
          uVar7 = uVar1;
        } while (uVar1 < uVar6);
      }
      __return_storage_ptr__->hash = uVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&__return_storage_ptr__->timestamps,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_58);
      pPVar4 = extraout_RAX;
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)timestamps.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
        pPVar4 = extraout_RAX_00;
      }
      if (local_70 != (uint64_t *)0x0) {
        operator_delete(local_70,local_60 - (long)local_70);
        pPVar4 = extraout_RAX_01;
      }
      return pPVar4;
    }
    wasm::Fatal::Fatal((Fatal *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200 + 0x10),"Unexpected end of profile data in ",0x22);
    wasm::Fatal::operator<<((Fatal *)local_200,file);
  }
LAB_0010f008:
  wasm::Fatal::~Fatal((Fatal *)local_200);
}

Assistant:

ProfileData readProfile(const std::string& file) {
  auto profileData = read_file<std::vector<char>>(file, Flags::Binary);
  size_t i = 0;
  auto readi32 = [&]() {
    if (i + 4 > profileData.size()) {
      Fatal() << "Unexpected end of profile data in " << file;
    }
    uint32_t i32 = 0;
    i32 |= uint32_t(uint8_t(profileData[i++]));
    i32 |= uint32_t(uint8_t(profileData[i++])) << 8;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 16;
    i32 |= uint32_t(uint8_t(profileData[i++])) << 24;
    return i32;
  };

  uint64_t hash = readi32();
  hash |= uint64_t(readi32()) << 32;

  std::vector<size_t> timestamps;
  while (i < profileData.size()) {
    timestamps.push_back(readi32());
  }

  return {hash, timestamps};
}